

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int glfwInit(void)

{
  int iVar1;
  
  if (_glfw.initialized == 0) {
    memset(&_glfw,0,0xe88);
    iVar1 = _glfwPlatformInit();
    if (iVar1 == 0) {
      terminate();
      return 0;
    }
    _glfw.initialized = 1;
    _glfw.timerOffset = _glfwPlatformGetTimerValue();
    glfwDefaultWindowHints();
  }
  return 1;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfw.initialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));

    if (!_glfwPlatformInit())
    {
        terminate();
        return GLFW_FALSE;
    }

    _glfw.initialized = GLFW_TRUE;
    _glfw.timerOffset = _glfwPlatformGetTimerValue();

    // Not all window hints have zero as their default value
    glfwDefaultWindowHints();

    return GLFW_TRUE;
}